

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O0

CURLproxycode
Curl_SOCKS5(char *proxy_user,char *proxy_password,char *hostname,int remote_port,int sockindex,
           Curl_easy *data,_Bool *done)

{
  byte bVar1;
  connectdata *pcVar2;
  resolve_t rVar3;
  size_t sVar4;
  long lVar5;
  int addrlen;
  int code;
  CURLproxycode rc_1;
  sockaddr_in6 *saddr_in6;
  int i_1;
  sockaddr_in *saddr_in;
  int i;
  size_t destlen;
  Curl_addrinfo *hp;
  size_t sStack_1b0;
  resolve_t rc;
  size_t proxy_password_len;
  size_t proxy_user_len;
  Curl_dns_entry *dns;
  connstate *sx;
  unsigned_long uStack_188;
  _Bool allow_gssapi;
  unsigned_long auth;
  ssize_t len;
  size_t hostname_len;
  curl_socket_t local_168;
  CURLcode CStack_164;
  _Bool socks5_resolve_local;
  curl_socket_t sockfd;
  CURLcode result;
  ssize_t written;
  ssize_t actualread;
  char local_148 [4];
  int idx;
  char dest [256];
  uchar *socksreq;
  connectdata *conn;
  Curl_easy *data_local;
  int sockindex_local;
  int remote_port_local;
  char *hostname_local;
  char *proxy_password_local;
  char *proxy_user_local;
  
  pcVar2 = data->conn;
  dest._248_8_ = (data->state).buffer;
  memcpy(local_148,"unknown",0x100);
  local_168 = pcVar2->sock[sockindex];
  hostname_len._7_1_ = (pcVar2->socks_proxy).proxytype == CURLPROXY_SOCKS5;
  len = strlen(hostname);
  auth = 0;
  uStack_188 = (data->set).socks5auth;
  sx._7_1_ = 0;
  proxy_user_len = 0;
  dns = (Curl_dns_entry *)pcVar2;
  if ((((pcVar2->cnnct).state == CONNECT_INIT) || (CONNECT_REQ_READ_MORE < (pcVar2->cnnct).state))
     && ((*done & 1U) == 0)) {
    socksstate(data,CONNECT_SOCKS_INIT);
  }
  proxy_password_local = proxy_user;
  switch(*(undefined4 *)&dns->addr) {
  case 1:
    if ((*(ulong *)&(pcVar2->bits).field_0x4 & 1) != 0) {
      Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d",hostname,
                 (ulong)(uint)remote_port);
    }
    if (((hostname_len._7_1_ & 1) == 0) && (0xff < (ulong)len)) {
      Curl_infof(data,
                 "SOCKS5: server resolving disabled for hostnames of length > 255 [actual len=%zu]",
                 len);
      hostname_len._7_1_ = 1;
    }
    if ((uStack_188 & 0xfffffffffffffffa) != 0) {
      Curl_infof(data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %lu",uStack_188);
    }
    if ((uStack_188 & 1) == 0) {
      proxy_password_local = (char *)0x0;
    }
    *(undefined1 *)dest._248_8_ = 5;
    actualread._4_4_ = 3;
    *(undefined1 *)(dest._248_8_ + 2) = 0;
    if ((sx._7_1_ & 1) != 0) {
      actualread._4_4_ = 4;
      *(undefined1 *)(dest._248_8_ + 3) = 1;
    }
    if (proxy_password_local != (char *)0x0) {
      *(undefined1 *)(dest._248_8_ + (long)actualread._4_4_) = 2;
      actualread._4_4_ = actualread._4_4_ + 1;
    }
    *(char *)(dest._248_8_ + 1) = (char)actualread._4_4_ + -2;
    CStack_164 = Curl_write_plain(data,local_168,(void *)dest._248_8_,(long)actualread._4_4_,
                                  (ssize_t *)&sockfd);
    if ((CStack_164 != CURLE_OK) && (CStack_164 != CURLE_AGAIN)) {
      Curl_failf(data,"Unable to send initial SOCKS5 request.");
      return CURLPX_SEND_CONNECT;
    }
    if (_sockfd != actualread._4_4_) {
      socksstate(data,CONNECT_SOCKS_SEND);
      dns->timestamp = actualread._4_4_ - _sockfd;
      dns->inuse = dest._248_8_ + _sockfd;
      return CURLPX_OK;
    }
    socksstate(data,CONNECT_SOCKS_READ);
    break;
  case 2:
    CStack_164 = Curl_write_plain(data,local_168,(void *)dns->inuse,dns->timestamp,
                                  (ssize_t *)&sockfd);
    if ((CStack_164 != CURLE_OK) && (CStack_164 != CURLE_AGAIN)) {
      Curl_failf(data,"Unable to send initial SOCKS5 request.");
      return CURLPX_SEND_CONNECT;
    }
    if (_sockfd != dns->timestamp) {
      dns->timestamp = dns->timestamp - _sockfd;
      dns->inuse = _sockfd + dns->inuse;
      return CURLPX_OK;
    }
    break;
  case 3:
    break;
  case 4:
    goto switchD_00169d7e_caseD_4;
  default:
    goto LAB_0016af98;
  case 6:
    goto switchD_00169d7e_caseD_6;
  case 7:
    goto switchD_00169d7e_caseD_7;
  case 8:
    goto switchD_00169d7e_caseD_8;
  case 9:
    goto switchD_00169d7e_caseD_9;
  case 10:
    proxy_user_len = (size_t)Curl_fetch_addr(data,hostname,remote_port);
    if ((Curl_dns_entry *)proxy_user_len != (Curl_dns_entry *)0x0) {
      (data->state).async.dns = (Curl_dns_entry *)proxy_user_len;
      (data->state).async.field_0x28 = (data->state).async.field_0x28 & 0xfe | 1;
      Curl_infof(data,"SOCKS5: hostname \'%s\' found",hostname);
    }
    if ((proxy_user_len == 0) &&
       (CStack_164 = Curl_resolv_check(data,(Curl_dns_entry **)&proxy_user_len), proxy_user_len == 0
       )) {
      if (CStack_164 != CURLE_OK) {
        return CURLPX_RESOLVE_HOST;
      }
      return CURLPX_OK;
    }
  case 0xb:
    goto switchD_00169d7e_caseD_b;
  case 0xc:
    goto switchD_00169d7e_caseD_c;
  case 0xd:
    goto switchD_00169d7e_caseD_d;
  case 0xe:
    goto switchD_00169d7e_caseD_e;
  case 0xf:
    goto switchD_00169d7e_caseD_f;
  case 0x10:
    goto switchD_00169d7e_caseD_10;
  }
  dns->timestamp = 2;
  dns->inuse = dest._248_8_;
switchD_00169d7e_caseD_4:
  CStack_164 = Curl_read_plain(local_168,(char *)dns->inuse,dns->timestamp,&written);
  if ((CStack_164 == CURLE_OK) || (CStack_164 == CURLE_AGAIN)) {
    if ((CStack_164 == CURLE_OK) && (written == 0)) {
      Curl_failf(data,"Connection to proxy closed");
      proxy_user_local._4_4_ = CURLPX_CLOSED;
    }
    else if (written == dns->timestamp) {
      if (*(char *)dest._248_8_ == '\x05') {
        if (*(char *)(dest._248_8_ + 1) == '\0') {
          socksstate(data,CONNECT_REQ_INIT);
        }
        else {
          if (*(char *)(dest._248_8_ + 1) != '\x02') {
            if (((sx._7_1_ & 1) == 0) && (*(char *)(dest._248_8_ + 1) == '\x01')) {
              Curl_failf(data,"SOCKS5 GSSAPI per-message authentication is not supported.");
              return CURLPX_GSSAPI_PERMSG;
            }
            if (*(char *)(dest._248_8_ + 1) == -1) {
              Curl_failf(data,"No authentication method was acceptable.");
              return CURLPX_NO_AUTH;
            }
            Curl_failf(data,"Undocumented SOCKS5 mode attempted to be used by server.");
            return CURLPX_UNKNOWN_MODE;
          }
          socksstate(data,CONNECT_AUTH_INIT);
switchD_00169d7e_caseD_6:
          if ((proxy_password_local == (char *)0x0) || (proxy_password == (char *)0x0)) {
            proxy_password_len = 0;
            sStack_1b0 = 0;
          }
          else {
            proxy_password_len = strlen(proxy_password_local);
            sStack_1b0 = strlen(proxy_password);
          }
          *(undefined1 *)dest._248_8_ = 1;
          auth = 2;
          *(char *)(dest._248_8_ + 1) = (char)proxy_password_len;
          if ((proxy_password_local != (char *)0x0) && (proxy_password_len != 0)) {
            if (0xfe < proxy_password_len) {
              Curl_failf(data,"Excessive user name length for proxy auth");
              return CURLPX_LONG_USER;
            }
            memcpy((void *)(dest._248_8_ + 2),proxy_password_local,proxy_password_len);
          }
          lVar5 = proxy_password_len + auth;
          auth = lVar5 + 1;
          *(char *)(dest._248_8_ + lVar5) = (char)sStack_1b0;
          if ((proxy_password != (char *)0x0) && (sStack_1b0 != 0)) {
            if (0xff < sStack_1b0) {
              Curl_failf(data,"Excessive password length for proxy auth");
              return CURLPX_LONG_PASSWD;
            }
            memcpy((void *)(dest._248_8_ + auth),proxy_password,sStack_1b0);
          }
          auth = sStack_1b0 + auth;
          socksstate(data,CONNECT_AUTH_SEND);
          dns->timestamp = auth;
          dns->inuse = dest._248_8_;
switchD_00169d7e_caseD_7:
          CStack_164 = Curl_write_plain(data,local_168,(void *)dns->inuse,dns->timestamp,
                                        (ssize_t *)&sockfd);
          if ((CStack_164 != CURLE_OK) && (CStack_164 != CURLE_AGAIN)) {
            Curl_failf(data,"Failed to send SOCKS5 sub-negotiation request.");
            return CURLPX_SEND_AUTH;
          }
          if (dns->timestamp != _sockfd) {
            dns->timestamp = dns->timestamp - _sockfd;
            dns->inuse = _sockfd + dns->inuse;
            return CURLPX_OK;
          }
          dns->inuse = dest._248_8_;
          dns->timestamp = 2;
          socksstate(data,CONNECT_AUTH_READ);
switchD_00169d7e_caseD_8:
          CStack_164 = Curl_read_plain(local_168,(char *)dns->inuse,dns->timestamp,&written);
          if ((CStack_164 != CURLE_OK) && (CStack_164 != CURLE_AGAIN)) {
            Curl_failf(data,"Unable to receive SOCKS5 sub-negotiation response.");
            return CURLPX_RECV_AUTH;
          }
          if ((CStack_164 == CURLE_OK) && (written == 0)) {
            Curl_failf(data,"connection to proxy closed");
            return CURLPX_CLOSED;
          }
          if (written != dns->timestamp) {
            dns->timestamp = dns->timestamp - written;
            dns->inuse = written + dns->inuse;
            return CURLPX_OK;
          }
          if (*(char *)(dest._248_8_ + 1) != '\0') {
            Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",
                       (ulong)*(byte *)dest._248_8_,(ulong)*(byte *)(dest._248_8_ + 1));
            return CURLPX_USER_REJECTED;
          }
          socksstate(data,CONNECT_REQ_INIT);
        }
switchD_00169d7e_caseD_9:
        if ((hostname_len._7_1_ & 1) == 0) {
switchD_00169d7e_caseD_c:
          *(undefined1 *)dest._248_8_ = 5;
          *(undefined1 *)(dest._248_8_ + 1) = 1;
          auth = 3;
          *(undefined1 *)(dest._248_8_ + 2) = 0;
          if ((hostname_len._7_1_ & 1) == 0) {
            *(undefined1 *)(dest._248_8_ + 3) = 3;
            auth = 5;
            *(char *)(dest._248_8_ + 4) = (char)len;
            memcpy((void *)(dest._248_8_ + 5),hostname,len);
            auth = len + auth;
            Curl_infof(data,"SOCKS5 connect to %s:%d (remotely resolved)",hostname,
                       (ulong)(uint)remote_port);
          }
        }
        else {
          rVar3 = Curl_resolv(data,hostname,remote_port,false,(Curl_dns_entry **)&proxy_user_len);
          if (rVar3 == CURLRESOLV_ERROR) {
            return CURLPX_RESOLVE_HOST;
          }
          if (rVar3 == CURLRESOLV_PENDING) {
            socksstate(data,CONNECT_RESOLVING);
            return CURLPX_OK;
          }
          socksstate(data,CONNECT_RESOLVED);
switchD_00169d7e_caseD_b:
          destlen = 0;
          if (proxy_user_len != 0) {
            destlen = *(size_t *)proxy_user_len;
          }
          if (destlen == 0) {
            Curl_failf(data,"Failed to resolve \"%s\" for SOCKS5 connect.",hostname);
            return CURLPX_RESOLVE_HOST;
          }
          Curl_printable_address((Curl_addrinfo *)destlen,local_148,0x100);
          sVar4 = strlen(local_148);
          curl_msnprintf(local_148 + sVar4,0x100 - sVar4,":%d",(ulong)(uint)remote_port);
          *(undefined1 *)dest._248_8_ = 5;
          *(undefined1 *)(dest._248_8_ + 1) = 1;
          auth = 3;
          *(undefined1 *)(dest._248_8_ + 2) = 0;
          if (*(int *)(destlen + 4) == 2) {
            *(undefined1 *)(dest._248_8_ + 3) = 1;
            lVar5 = *(long *)(destlen + 0x20);
            auth = 4;
            for (saddr_in._4_4_ = 0; saddr_in._4_4_ < 4; saddr_in._4_4_ = saddr_in._4_4_ + 1) {
              *(undefined1 *)(dest._248_8_ + auth) =
                   *(undefined1 *)(lVar5 + 4 + (long)saddr_in._4_4_);
              auth = auth + 1;
            }
            Curl_infof(data,"SOCKS5 connect to IPv4 %s (locally resolved)",local_148);
          }
          else if (*(int *)(destlen + 4) == 10) {
            *(undefined1 *)(dest._248_8_ + 3) = 4;
            lVar5 = *(long *)(destlen + 0x20);
            auth = 4;
            for (saddr_in6._4_4_ = 0; saddr_in6._4_4_ < 0x10; saddr_in6._4_4_ = saddr_in6._4_4_ + 1)
            {
              *(undefined1 *)(dest._248_8_ + auth) =
                   *(undefined1 *)(lVar5 + 8 + (long)saddr_in6._4_4_);
              auth = auth + 1;
            }
            Curl_infof(data,"SOCKS5 connect to IPv6 %s (locally resolved)",local_148);
          }
          else {
            Curl_failf(data,"SOCKS5 connection to %s not supported",local_148);
          }
          Curl_resolv_unlock(data,(Curl_dns_entry *)proxy_user_len);
        }
switchD_00169d7e_caseD_d:
        lVar5 = auth + 1;
        *(char *)(dest._248_8_ + auth) = (char)((uint)remote_port >> 8);
        auth = auth + 2;
        *(char *)(dest._248_8_ + lVar5) = (char)remote_port;
        dns->inuse = dest._248_8_;
        dns->timestamp = auth;
        socksstate(data,CONNECT_REQ_SENDING);
switchD_00169d7e_caseD_e:
        CStack_164 = Curl_write_plain(data,local_168,(void *)dns->inuse,dns->timestamp,
                                      (ssize_t *)&sockfd);
        if ((CStack_164 == CURLE_OK) || (CStack_164 == CURLE_AGAIN)) {
          if (dns->timestamp == _sockfd) {
            dns->timestamp = 10;
            dns->inuse = dest._248_8_;
            socksstate(data,CONNECT_REQ_READ);
switchD_00169d7e_caseD_f:
            CStack_164 = Curl_read_plain(local_168,(char *)dns->inuse,dns->timestamp,&written);
            if ((CStack_164 == CURLE_OK) || (CStack_164 == CURLE_AGAIN)) {
              if ((CStack_164 == CURLE_OK) && (written == 0)) {
                Curl_failf(data,"connection to proxy closed");
                proxy_user_local._4_4_ = CURLPX_CLOSED;
              }
              else if (written == dns->timestamp) {
                if (*(char *)dest._248_8_ == '\x05') {
                  if (*(char *)(dest._248_8_ + 1) == '\0') {
                    if (*(char *)(dest._248_8_ + 3) == '\x03') {
                      auth = (unsigned_long)(int)(*(byte *)(dest._248_8_ + 4) + 7);
                    }
                    else if (*(char *)(dest._248_8_ + 3) == '\x04') {
                      auth = 0x16;
                    }
                    else {
                      if (*(char *)(dest._248_8_ + 3) != '\x01') {
                        Curl_failf(data,"SOCKS5 reply has wrong address type.");
                        return CURLPX_BAD_ADDRESS_TYPE;
                      }
                      auth = 10;
                    }
                    if (auth < 0xb) {
                      socksstate(data,CONNECT_DONE);
                    }
                    else {
                      dns->timestamp = auth - 10;
                      dns->inuse = dest._248_8_ + 10;
                      socksstate(data,CONNECT_REQ_READ_MORE);
switchD_00169d7e_caseD_10:
                      CStack_164 = Curl_read_plain(local_168,(char *)dns->inuse,dns->timestamp,
                                                   &written);
                      if ((CStack_164 != CURLE_OK) && (CStack_164 != CURLE_AGAIN)) {
                        Curl_failf(data,"Failed to receive SOCKS5 connect request ack.");
                        return CURLPX_RECV_ADDRESS;
                      }
                      if ((CStack_164 == CURLE_OK) && (written == 0)) {
                        Curl_failf(data,"connection to proxy closed");
                        return CURLPX_CLOSED;
                      }
                      if (written != dns->timestamp) {
                        dns->timestamp = dns->timestamp - written;
                        dns->inuse = written + dns->inuse;
                        return CURLPX_OK;
                      }
                      socksstate(data,CONNECT_DONE);
                    }
LAB_0016af98:
                    Curl_infof(data,"SOCKS5 request granted.");
                    *done = true;
                    proxy_user_local._4_4_ = CURLPX_OK;
                  }
                  else {
                    addrlen = 0x19;
                    bVar1 = *(byte *)(dest._248_8_ + 1);
                    Curl_failf(data,"Can\'t complete SOCKS5 connection to %s. (%d)",hostname,
                               (ulong)*(byte *)(dest._248_8_ + 1));
                    if (bVar1 < 9) {
                      addrlen = Curl_SOCKS5::lookup[(int)(uint)bVar1];
                    }
                    proxy_user_local._4_4_ = addrlen;
                  }
                }
                else {
                  Curl_failf(data,"SOCKS5 reply has wrong version, version should be 5.");
                  proxy_user_local._4_4_ = CURLPX_BAD_VERSION;
                }
              }
              else {
                dns->timestamp = dns->timestamp - written;
                dns->inuse = written + dns->inuse;
                proxy_user_local._4_4_ = CURLPX_OK;
              }
            }
            else {
              Curl_failf(data,"Failed to receive SOCKS5 connect request ack.");
              proxy_user_local._4_4_ = CURLPX_RECV_REQACK;
            }
          }
          else {
            dns->timestamp = dns->timestamp - _sockfd;
            dns->inuse = _sockfd + dns->inuse;
            proxy_user_local._4_4_ = CURLPX_OK;
          }
        }
        else {
          Curl_failf(data,"Failed to send SOCKS5 connect request.");
          proxy_user_local._4_4_ = CURLPX_SEND_REQUEST;
        }
      }
      else {
        Curl_failf(data,"Received invalid version in initial SOCKS5 response.");
        proxy_user_local._4_4_ = CURLPX_BAD_VERSION;
      }
    }
    else {
      dns->timestamp = dns->timestamp - written;
      dns->inuse = written + dns->inuse;
      proxy_user_local._4_4_ = CURLPX_OK;
    }
  }
  else {
    Curl_failf(data,"Unable to receive initial SOCKS5 response.");
    proxy_user_local._4_4_ = CURLPX_RECV_CONNECT;
  }
  return proxy_user_local._4_4_;
}

Assistant:

CURLproxycode Curl_SOCKS5(const char *proxy_user,
                          const char *proxy_password,
                          const char *hostname,
                          int remote_port,
                          int sockindex,
                          struct Curl_easy *data,
                          bool *done)
{
  /*
    According to the RFC1928, section "6.  Replies". This is what a SOCK5
    replies:

        +----+-----+-------+------+----------+----------+
        |VER | REP |  RSV  | ATYP | BND.ADDR | BND.PORT |
        +----+-----+-------+------+----------+----------+
        | 1  |  1  | X'00' |  1   | Variable |    2     |
        +----+-----+-------+------+----------+----------+

    Where:

    o  VER    protocol version: X'05'
    o  REP    Reply field:
    o  X'00' succeeded
  */
  struct connectdata *conn = data->conn;
  unsigned char *socksreq = (unsigned char *)data->state.buffer;
  char dest[256] = "unknown";  /* printable hostname:port */
  int idx;
  ssize_t actualread;
  ssize_t written;
  CURLcode result;
  curl_socket_t sockfd = conn->sock[sockindex];
  bool socks5_resolve_local =
    (conn->socks_proxy.proxytype == CURLPROXY_SOCKS5) ? TRUE : FALSE;
  const size_t hostname_len = strlen(hostname);
  ssize_t len = 0;
  const unsigned long auth = data->set.socks5auth;
  bool allow_gssapi = FALSE;
  struct connstate *sx = &conn->cnnct;
  struct Curl_dns_entry *dns = NULL;

  if(!SOCKS_STATE(sx->state) && !*done)
    sxstate(data, CONNECT_SOCKS_INIT);

  switch(sx->state) {
  case CONNECT_SOCKS_INIT:
    if(conn->bits.httpproxy)
      infof(data, "SOCKS5: connecting to HTTP proxy %s port %d",
            hostname, remote_port);

    /* RFC1928 chapter 5 specifies max 255 chars for domain name in packet */
    if(!socks5_resolve_local && hostname_len > 255) {
      infof(data, "SOCKS5: server resolving disabled for hostnames of "
            "length > 255 [actual len=%zu]", hostname_len);
      socks5_resolve_local = TRUE;
    }

    if(auth & ~(CURLAUTH_BASIC | CURLAUTH_GSSAPI))
      infof(data,
            "warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %lu",
            auth);
    if(!(auth & CURLAUTH_BASIC))
      /* disable username/password auth */
      proxy_user = NULL;
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(auth & CURLAUTH_GSSAPI)
      allow_gssapi = TRUE;
#endif

    idx = 0;
    socksreq[idx++] = 5;   /* version */
    idx++;                 /* number of authentication methods */
    socksreq[idx++] = 0;   /* no authentication */
    if(allow_gssapi)
      socksreq[idx++] = 1; /* GSS-API */
    if(proxy_user)
      socksreq[idx++] = 2; /* username/password */
    /* write the number of authentication methods */
    socksreq[1] = (unsigned char) (idx - 2);

    result = Curl_write_plain(data, sockfd, (char *)socksreq, idx, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to send initial SOCKS5 request.");
      return CURLPX_SEND_CONNECT;
    }
    if(written != idx) {
      sxstate(data, CONNECT_SOCKS_SEND);
      sx->outstanding = idx - written;
      sx->outp = &socksreq[written];
      return CURLPX_OK;
    }
    sxstate(data, CONNECT_SOCKS_READ);
    goto CONNECT_SOCKS_READ_INIT;
  case CONNECT_SOCKS_SEND:
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to send initial SOCKS5 request.");
      return CURLPX_SEND_CONNECT;
    }
    if(written != sx->outstanding) {
      /* not done, remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }
    /* FALLTHROUGH */
  CONNECT_SOCKS_READ_INIT:
  case CONNECT_SOCKS_READ_INIT:
    sx->outstanding = 2; /* expect two bytes */
    sx->outp = socksreq; /* store it here */
    /* FALLTHROUGH */
  case CONNECT_SOCKS_READ:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to receive initial SOCKS5 response.");
      return CURLPX_RECV_CONNECT;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "Connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in reading state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    else if(socksreq[0] != 5) {
      failf(data, "Received invalid version in initial SOCKS5 response.");
      return CURLPX_BAD_VERSION;
    }
    else if(socksreq[1] == 0) {
      /* DONE! No authentication needed. Send request. */
      sxstate(data, CONNECT_REQ_INIT);
      goto CONNECT_REQ_INIT;
    }
    else if(socksreq[1] == 2) {
      /* regular name + password authentication */
      sxstate(data, CONNECT_AUTH_INIT);
      goto CONNECT_AUTH_INIT;
    }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    else if(allow_gssapi && (socksreq[1] == 1)) {
      sxstate(data, CONNECT_GSSAPI_INIT);
      result = Curl_SOCKS5_gssapi_negotiate(sockindex, data);
      if(result) {
        failf(data, "Unable to negotiate SOCKS5 GSS-API context.");
        return CURLPX_GSSAPI;
      }
    }
#endif
    else {
      /* error */
      if(!allow_gssapi && (socksreq[1] == 1)) {
        failf(data,
              "SOCKS5 GSSAPI per-message authentication is not supported.");
        return CURLPX_GSSAPI_PERMSG;
      }
      else if(socksreq[1] == 255) {
        failf(data, "No authentication method was acceptable.");
        return CURLPX_NO_AUTH;
      }
    }
    failf(data,
          "Undocumented SOCKS5 mode attempted to be used by server.");
    return CURLPX_UNKNOWN_MODE;
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
  case CONNECT_GSSAPI_INIT:
    /* GSSAPI stuff done non-blocking */
    break;
#endif

  default: /* do nothing! */
    break;

  CONNECT_AUTH_INIT:
  case CONNECT_AUTH_INIT: {
    /* Needs user name and password */
    size_t proxy_user_len, proxy_password_len;
    if(proxy_user && proxy_password) {
      proxy_user_len = strlen(proxy_user);
      proxy_password_len = strlen(proxy_password);
    }
    else {
      proxy_user_len = 0;
      proxy_password_len = 0;
    }

    /*   username/password request looks like
     * +----+------+----------+------+----------+
     * |VER | ULEN |  UNAME   | PLEN |  PASSWD  |
     * +----+------+----------+------+----------+
     * | 1  |  1   | 1 to 255 |  1   | 1 to 255 |
     * +----+------+----------+------+----------+
     */
    len = 0;
    socksreq[len++] = 1;    /* username/pw subnegotiation version */
    socksreq[len++] = (unsigned char) proxy_user_len;
    if(proxy_user && proxy_user_len) {
      /* the length must fit in a single byte */
      if(proxy_user_len >= 255) {
        failf(data, "Excessive user name length for proxy auth");
        return CURLPX_LONG_USER;
      }
      memcpy(socksreq + len, proxy_user, proxy_user_len);
    }
    len += proxy_user_len;
    socksreq[len++] = (unsigned char) proxy_password_len;
    if(proxy_password && proxy_password_len) {
      /* the length must fit in a single byte */
      if(proxy_password_len > 255) {
        failf(data, "Excessive password length for proxy auth");
        return CURLPX_LONG_PASSWD;
      }
      memcpy(socksreq + len, proxy_password, proxy_password_len);
    }
    len += proxy_password_len;
    sxstate(data, CONNECT_AUTH_SEND);
    sx->outstanding = len;
    sx->outp = socksreq;
  }
    /* FALLTHROUGH */
  case CONNECT_AUTH_SEND:
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to send SOCKS5 sub-negotiation request.");
      return CURLPX_SEND_AUTH;
    }
    if(sx->outstanding != written) {
      /* remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }
    sx->outp = socksreq;
    sx->outstanding = 2;
    sxstate(data, CONNECT_AUTH_READ);
    /* FALLTHROUGH */
  case CONNECT_AUTH_READ:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to receive SOCKS5 sub-negotiation response.");
      return CURLPX_RECV_AUTH;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    /* ignore the first (VER) byte */
    else if(socksreq[1]) { /* status */
      failf(data, "User was rejected by the SOCKS5 server (%d %d).",
            socksreq[0], socksreq[1]);
      return CURLPX_USER_REJECTED;
    }

    /* Everything is good so far, user was authenticated! */
    sxstate(data, CONNECT_REQ_INIT);
    /* FALLTHROUGH */
  CONNECT_REQ_INIT:
  case CONNECT_REQ_INIT:
    if(socks5_resolve_local) {
      enum resolve_t rc = Curl_resolv(data, hostname, remote_port,
                                      FALSE, &dns);

      if(rc == CURLRESOLV_ERROR)
        return CURLPX_RESOLVE_HOST;

      if(rc == CURLRESOLV_PENDING) {
        sxstate(data, CONNECT_RESOLVING);
        return CURLPX_OK;
      }
      sxstate(data, CONNECT_RESOLVED);
      goto CONNECT_RESOLVED;
    }
    goto CONNECT_RESOLVE_REMOTE;

  case CONNECT_RESOLVING:
    /* check if we have the name resolved by now */
    dns = Curl_fetch_addr(data, hostname, remote_port);

    if(dns) {
#ifdef CURLRES_ASYNCH
      data->state.async.dns = dns;
      data->state.async.done = TRUE;
#endif
      infof(data, "SOCKS5: hostname '%s' found", hostname);
    }

    if(!dns) {
      result = Curl_resolv_check(data, &dns);
      if(!dns) {
        if(result)
          return CURLPX_RESOLVE_HOST;
        return CURLPX_OK;
      }
    }
    /* FALLTHROUGH */
  CONNECT_RESOLVED:
  case CONNECT_RESOLVED: {
    struct Curl_addrinfo *hp = NULL;
    size_t destlen;
    if(dns)
      hp = dns->addr;
    if(!hp) {
      failf(data, "Failed to resolve \"%s\" for SOCKS5 connect.",
            hostname);
      return CURLPX_RESOLVE_HOST;
    }

    Curl_printable_address(hp, dest, sizeof(dest));
    destlen = strlen(dest);
    msnprintf(dest + destlen, sizeof(dest) - destlen, ":%d", remote_port);

    len = 0;
    socksreq[len++] = 5; /* version (SOCKS5) */
    socksreq[len++] = 1; /* connect */
    socksreq[len++] = 0; /* must be zero */
    if(hp->ai_family == AF_INET) {
      int i;
      struct sockaddr_in *saddr_in;
      socksreq[len++] = 1; /* ATYP: IPv4 = 1 */

      saddr_in = (struct sockaddr_in *)(void *)hp->ai_addr;
      for(i = 0; i < 4; i++) {
        socksreq[len++] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[i];
      }

      infof(data, "SOCKS5 connect to IPv4 %s (locally resolved)", dest);
    }
#ifdef ENABLE_IPV6
    else if(hp->ai_family == AF_INET6) {
      int i;
      struct sockaddr_in6 *saddr_in6;
      socksreq[len++] = 4; /* ATYP: IPv6 = 4 */

      saddr_in6 = (struct sockaddr_in6 *)(void *)hp->ai_addr;
      for(i = 0; i < 16; i++) {
        socksreq[len++] =
          ((unsigned char *)&saddr_in6->sin6_addr.s6_addr)[i];
      }

      infof(data, "SOCKS5 connect to IPv6 %s (locally resolved)", dest);
    }
#endif
    else {
      hp = NULL; /* fail! */
      failf(data, "SOCKS5 connection to %s not supported", dest);
    }

    Curl_resolv_unlock(data, dns); /* not used anymore from now on */
    goto CONNECT_REQ_SEND;
  }
  CONNECT_RESOLVE_REMOTE:
  case CONNECT_RESOLVE_REMOTE:
    /* Authentication is complete, now specify destination to the proxy */
    len = 0;
    socksreq[len++] = 5; /* version (SOCKS5) */
    socksreq[len++] = 1; /* connect */
    socksreq[len++] = 0; /* must be zero */

    if(!socks5_resolve_local) {
      socksreq[len++] = 3; /* ATYP: domain name = 3 */
      socksreq[len++] = (char) hostname_len; /* one byte address length */
      memcpy(&socksreq[len], hostname, hostname_len); /* address w/o NULL */
      len += hostname_len;
      infof(data, "SOCKS5 connect to %s:%d (remotely resolved)",
            hostname, remote_port);
    }
    /* FALLTHROUGH */

  CONNECT_REQ_SEND:
  case CONNECT_REQ_SEND:
    /* PORT MSB */
    socksreq[len++] = (unsigned char)((remote_port >> 8) & 0xff);
    /* PORT LSB */
    socksreq[len++] = (unsigned char)(remote_port & 0xff);

#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(conn->socks5_gssapi_enctype) {
      failf(data, "SOCKS5 GSS-API protection not yet implemented.");
      return CURLPX_GSSAPI_PROTECTION;
    }
#endif
    sx->outp = socksreq;
    sx->outstanding = len;
    sxstate(data, CONNECT_REQ_SENDING);
    /* FALLTHROUGH */
  case CONNECT_REQ_SENDING:
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to send SOCKS5 connect request.");
      return CURLPX_SEND_REQUEST;
    }
    if(sx->outstanding != written) {
      /* remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(conn->socks5_gssapi_enctype) {
      failf(data, "SOCKS5 GSS-API protection not yet implemented.");
      return CURLPX_GSSAPI_PROTECTION;
    }
#endif
    sx->outstanding = 10; /* minimum packet size is 10 */
    sx->outp = socksreq;
    sxstate(data, CONNECT_REQ_READ);
    /* FALLTHROUGH */
  case CONNECT_REQ_READ:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to receive SOCKS5 connect request ack.");
      return CURLPX_RECV_REQACK;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }

    if(socksreq[0] != 5) { /* version */
      failf(data,
            "SOCKS5 reply has wrong version, version should be 5.");
      return CURLPX_BAD_VERSION;
    }
    else if(socksreq[1]) { /* Anything besides 0 is an error */
      CURLproxycode rc = CURLPX_REPLY_UNASSIGNED;
      int code = socksreq[1];
      failf(data, "Can't complete SOCKS5 connection to %s. (%d)",
            hostname, (unsigned char)socksreq[1]);
      if(code < 9) {
        /* RFC 1928 section 6 lists: */
        static const CURLproxycode lookup[] = {
          CURLPX_OK,
          CURLPX_REPLY_GENERAL_SERVER_FAILURE,
          CURLPX_REPLY_NOT_ALLOWED,
          CURLPX_REPLY_NETWORK_UNREACHABLE,
          CURLPX_REPLY_HOST_UNREACHABLE,
          CURLPX_REPLY_CONNECTION_REFUSED,
          CURLPX_REPLY_TTL_EXPIRED,
          CURLPX_REPLY_COMMAND_NOT_SUPPORTED,
          CURLPX_REPLY_ADDRESS_TYPE_NOT_SUPPORTED,
        };
        rc = lookup[code];
      }
      return rc;
    }

    /* Fix: in general, returned BND.ADDR is variable length parameter by RFC
       1928, so the reply packet should be read until the end to avoid errors
       at subsequent protocol level.

       +----+-----+-------+------+----------+----------+
       |VER | REP |  RSV  | ATYP | BND.ADDR | BND.PORT |
       +----+-----+-------+------+----------+----------+
       | 1  |  1  | X'00' |  1   | Variable |    2     |
       +----+-----+-------+------+----------+----------+

       ATYP:
       o  IP v4 address: X'01', BND.ADDR = 4 byte
       o  domain name:  X'03', BND.ADDR = [ 1 byte length, string ]
       o  IP v6 address: X'04', BND.ADDR = 16 byte
    */

    /* Calculate real packet size */
    if(socksreq[3] == 3) {
      /* domain name */
      int addrlen = (int) socksreq[4];
      len = 5 + addrlen + 2;
    }
    else if(socksreq[3] == 4) {
      /* IPv6 */
      len = 4 + 16 + 2;
    }
    else if(socksreq[3] == 1) {
      len = 4 + 4 + 2;
    }
    else {
      failf(data, "SOCKS5 reply has wrong address type.");
      return CURLPX_BAD_ADDRESS_TYPE;
    }

    /* At this point we already read first 10 bytes */
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(!conn->socks5_gssapi_enctype) {
      /* decrypt_gssapi_blockread already read the whole packet */
#endif
      if(len > 10) {
        sx->outstanding = len - 10; /* get the rest */
        sx->outp = &socksreq[10];
        sxstate(data, CONNECT_REQ_READ_MORE);
      }
      else {
        sxstate(data, CONNECT_DONE);
        break;
      }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    }
#endif
    /* FALLTHROUGH */
  case CONNECT_REQ_READ_MORE:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to receive SOCKS5 connect request ack.");
      return CURLPX_RECV_ADDRESS;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    sxstate(data, CONNECT_DONE);
  }
  infof(data, "SOCKS5 request granted.");

  *done = TRUE;
  return CURLPX_OK; /* Proxy was successful! */
}